

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result wabt::anon_unknown_1::CheckFuncTypeVarMatchesExplicit
                 (Location *loc,Module *module,FuncDeclaration *decl,Errors *errors)

{
  FuncType *this;
  Module *__args_1;
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  int __c;
  pointer *var;
  Result local_94;
  string local_90;
  ErrorLevel local_6c;
  string local_68;
  ErrorLevel local_44;
  Enum local_40;
  Enum local_3c;
  FuncType *local_38;
  FuncType *func_type;
  Errors *errors_local;
  FuncDeclaration *decl_local;
  Module *module_local;
  Location *loc_local;
  Result result;
  
  func_type = (FuncType *)errors;
  errors_local = (Errors *)decl;
  decl_local = (FuncDeclaration *)module;
  module_local = (Module *)loc;
  Result::Result((Result *)((long)&loc_local + 4),Ok);
  if (((ulong)(errors_local->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
              super__Vector_impl_data._M_start & 1) != 0) {
    var = &(errors_local->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    local_38 = Module::GetFuncType((Module *)decl_local,(Var *)var);
    if (local_38 == (FuncType *)0x0) {
      bVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::empty
                        ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)
                         &errors_local[3].
                          super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                          super__Vector_impl_data._M_finish);
      if ((!bVar1) ||
         (bVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::empty
                            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)
                             &errors_local[4].
                              super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                              super__Vector_impl_data._M_finish), !bVar1)) {
        bVar1 = Var::is_index((Var *)&(errors_local->
                                      super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)
                                      ._M_impl.super__Vector_impl_data._M_finish);
        __args_1 = module_local;
        this = func_type;
        if (bVar1) {
          local_44 = Error;
          pcVar2 = Var::index((Var *)&(errors_local->
                                      super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)
                                      ._M_impl.super__Vector_impl_data._M_finish,(char *)var,__c);
          StringPrintf_abi_cxx11_(&local_68,"invalid func type index %u",(ulong)pcVar2 & 0xffffffff)
          ;
          std::vector<wabt::Error,std::allocator<wabt::Error>>::
          emplace_back<wabt::ErrorLevel,wabt::Location_const&,std::__cxx11::string>
                    ((vector<wabt::Error,std::allocator<wabt::Error>> *)this,&local_44,
                     &__args_1->loc,&local_68);
          std::__cxx11::string::~string((string *)&local_68);
        }
        else {
          local_6c = Error;
          Var::name_abi_cxx11_
                    ((Var *)&(errors_local->
                             super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
                             super__Vector_impl_data._M_finish);
          uVar3 = std::__cxx11::string::c_str();
          StringPrintf_abi_cxx11_(&local_90,"expected func type identifier %s",uVar3);
          std::vector<wabt::Error,std::allocator<wabt::Error>>::
          emplace_back<wabt::ErrorLevel,wabt::Location_const&,std::__cxx11::string>
                    ((vector<wabt::Error,std::allocator<wabt::Error>> *)this,&local_6c,
                     &__args_1->loc,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
        }
        Result::Result(&local_94,Error);
        loc_local._4_4_ = local_94.enum_;
      }
    }
    else {
      local_3c = (Enum)CheckTypes(&module_local->loc,
                                  (TypeVector *)
                                  &errors_local[4].
                                   super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,
                                  &(local_38->sig).result_types,"function","result",
                                  (Errors *)func_type);
      Result::operator|=((Result *)((long)&loc_local + 4),(Result)local_3c);
      local_40 = (Enum)CheckTypes(&module_local->loc,
                                  (TypeVector *)
                                  &errors_local[3].
                                   super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,
                                  &(local_38->sig).param_types,"function","argument",
                                  (Errors *)func_type);
      Result::operator|=((Result *)((long)&loc_local + 4),(Result)local_40);
    }
  }
  return (Result)loc_local._4_4_;
}

Assistant:

Result CheckFuncTypeVarMatchesExplicit(const Location& loc,
                                       const Module& module,
                                       const FuncDeclaration& decl,
                                       Errors* errors) {
  Result result = Result::Ok;
  if (decl.has_func_type) {
    const FuncType* func_type = module.GetFuncType(decl.type_var);
    if (func_type) {
      result |=
          CheckTypes(loc, decl.sig.result_types, func_type->sig.result_types,
                     "function", "result", errors);
      result |=
          CheckTypes(loc, decl.sig.param_types, func_type->sig.param_types,
                     "function", "argument", errors);
    } else if (!(decl.sig.param_types.empty() &&
                 decl.sig.result_types.empty())) {
      // We want to check whether the function type at the explicit index
      // matches the given param and result types. If they were omitted then
      // they'll be resolved automatically (see
      // ResolveFuncTypeWithEmptySignature), but if they are provided then we
      // have to check. If we get here then the type var is invalid, so we
      // can't check whether they match.
      if (decl.type_var.is_index()) {
        errors->emplace_back(ErrorLevel::Error, loc,
                             StringPrintf("invalid func type index %" PRIindex,
                                          decl.type_var.index()));
      } else {
        errors->emplace_back(ErrorLevel::Error, loc,
                             StringPrintf("expected func type identifier %s",
                                          decl.type_var.name().c_str()));
      }
      result = Result::Error;
    }
  }
  return result;
}